

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# big_integer_testing.cpp
# Opt level: O3

big_integer *
anon_unknown.dwarf_cd9f::merge_all<big_integer>
          (big_integer *__return_storage_ptr__,vector<big_integer,_std::allocator<big_integer>_> *v)

{
  int8_t iVar1;
  pointer pbVar2;
  big_integer *pbVar3;
  bool bVar4;
  undefined8 extraout_RAX;
  char *in_R9;
  pointer __x;
  AssertionResult gtest_ar_;
  big_integer ab;
  big_integer b;
  big_integer a;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_d8;
  internal local_d0 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_c8;
  string local_c0;
  AssertHelper local_a0;
  big_integer *local_98;
  big_integer local_90;
  big_integer local_70;
  big_integer local_50;
  
  __x = (v->super__Vector_base<big_integer,_std::allocator<big_integer>_>)._M_impl.
        super__Vector_impl_data._M_start;
  pbVar2 = (v->super__Vector_base<big_integer,_std::allocator<big_integer>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  local_98 = __return_storage_ptr__;
  if (__x == pbVar2) {
    __assert_fail("!v.empty()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/maxLundin[P]BigInteger/big_integer_testing.cpp"
                  ,0x266,"T (anonymous namespace)::merge_all(std::vector<T>) [T = big_integer]");
  }
  if (0x20 < (ulong)((long)pbVar2 - (long)__x)) {
    do {
      extract_random_element<big_integer>(&local_50,v);
      extract_random_element<big_integer>(&local_70,v);
      operator*(&local_90,&local_50,&local_70);
      operator/((big_integer *)&local_c0,&local_90,&local_50);
      local_d0[0] = (internal)operator==((big_integer *)&local_c0,&local_70);
      local_c8.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (local_c0._M_dataplus._M_p == (char *)0x0) {
        if (!(bool)local_d0[0]) goto LAB_001408a1;
LAB_00140829:
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&local_c8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        operator/((big_integer *)&local_c0,&local_90,&local_70);
        local_d0[0] = (internal)operator==((big_integer *)&local_c0,&local_50);
        local_c8.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if (local_c0._M_dataplus._M_p == (char *)0x0) {
          if (!(bool)local_d0[0]) goto LAB_00140955;
        }
        else {
          operator_delete(local_c0._M_dataplus._M_p,
                          local_c0.field_2._M_allocated_capacity - (long)local_c0._M_dataplus._M_p);
          if (((byte)local_d0[0] & 1) == 0) {
LAB_00140955:
            testing::Message::Message((Message *)&local_d8);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      (&local_c0,local_d0,(AssertionResult *)"ab / b == a","false","true",in_R9);
            testing::internal::AssertHelper::AssertHelper
                      (&local_a0,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/maxLundin[P]BigInteger/big_integer_testing.cpp"
                       ,0x25f,local_c0._M_dataplus._M_p);
            testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_d8);
            testing::internal::AssertHelper::~AssertHelper(&local_a0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
              operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
            }
            if (local_d8.ptr_ !=
                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              bVar4 = testing::internal::IsTrue(true);
              if ((bVar4) &&
                 (local_d8.ptr_ !=
                  (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
                (**(code **)(*(long *)local_d8.ptr_ + 8))();
              }
            }
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset(&local_c8,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
            goto LAB_001409fc;
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&local_c8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        std::vector<big_integer,_std::allocator<big_integer>_>::push_back(v,&local_90);
      }
      else {
        operator_delete(local_c0._M_dataplus._M_p,
                        local_c0.field_2._M_allocated_capacity - (long)local_c0._M_dataplus._M_p);
        if (((byte)local_d0[0] & 1) != 0) goto LAB_00140829;
LAB_001408a1:
        testing::Message::Message((Message *)&local_d8);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (&local_c0,local_d0,(AssertionResult *)"ab / a == b","false","true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_a0,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/maxLundin[P]BigInteger/big_integer_testing.cpp"
                   ,0x25e,local_c0._M_dataplus._M_p);
        testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_d8);
        testing::internal::AssertHelper::~AssertHelper(&local_a0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
          operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
        }
        if (local_d8.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          bVar4 = testing::internal::IsTrue(true);
          if ((bVar4) &&
             (local_d8.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
            (**(code **)(*(long *)local_d8.ptr_ + 8))();
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&local_c8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      }
LAB_001409fc:
      if (local_90.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_90.digits.
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_90.digits.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_90.digits.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_70.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_70.digits.
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_70.digits.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_70.digits.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_50.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_50.digits.
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_50.digits.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_50.digits.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      __x = (v->super__Vector_base<big_integer,_std::allocator<big_integer>_>)._M_impl.
            super__Vector_impl_data._M_start;
    } while (0x20 < (ulong)((long)(v->super__Vector_base<big_integer,_std::allocator<big_integer>_>)
                                  ._M_impl.super__Vector_impl_data._M_finish - (long)__x));
  }
  pbVar3 = local_98;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_98->digits,&__x->digits);
  iVar1 = __x->sign;
  pbVar3->sign = iVar1;
  return (big_integer *)CONCAT71((int7)((ulong)extraout_RAX >> 8),iVar1);
}

Assistant:

T merge_all(std::vector<T> v) {
        assert(!v.empty());

        while (v.size() >= 2)
            merge_two(v);

        return v[0];
    }